

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O2

bool __thiscall
irr::scene::CB3DMeshFileLoader::readChunkBONE(CB3DMeshFileLoader *this,SJoint *inJoint)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined2 *puVar5;
  undefined1 *this_00;
  long lVar6;
  double __x;
  double __x_00;
  u32 globalVertexID;
  f32 strength;
  
  lVar6 = *(long *)&(this->super_IMeshLoader).field_0x10;
  iVar2 = *(int *)(lVar6 + -0xc);
  _globalVertexID = in_RAX;
  if (8 < iVar2) {
    while (lVar6 = *(long *)(lVar6 + -8), iVar3 = (*this->B3DFile->_vptr_IReadFile[3])(),
          CONCAT44(extraout_var,iVar3) < iVar2 + lVar6) {
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&globalVertexID,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&strength,4);
      uVar4 = globalVertexID + this->VerticesStart;
      _globalVertexID = CONCAT44(strength,uVar4);
      piVar1 = (this->AnimatedVertices_VertexID).m_data.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((uint)((ulong)((long)(this->AnimatedVertices_VertexID).m_data.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1) >> 2) <= uVar4) {
        (*this->B3DFile->_vptr_IReadFile[4])();
        os::Printer::log(__x_00);
        return false;
      }
      if (piVar1[uVar4] == -1) {
        os::Printer::log((Printer *)
                         "B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)"
                         ,__x);
      }
      else if (0.0 < (float)strength) {
        puVar5 = (undefined2 *)
                 (**(code **)(*(long *)this->AnimatedMesh + 0x100))(this->AnimatedMesh,inJoint);
        *(f32 *)(puVar5 + 4) = strength;
        *(int *)(puVar5 + 2) =
             (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start[_globalVertexID & 0xffffffff];
        *puVar5 = (short)(this->AnimatedVertices_BufferID).m_data.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[_globalVertexID & 0xffffffff];
      }
      lVar6 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar2 = *(int *)(lVar6 + -0xc);
    }
    lVar6 = *(long *)&(this->super_IMeshLoader).field_0x10;
  }
  this_00 = &(this->super_IMeshLoader).field_0x8;
  core::array<irr::scene::SB3dChunk>::erase
            ((array<irr::scene::SB3dChunk> *)this_00,
             (int)((ulong)(lVar6 - *(long *)this_00) >> 4) - 1);
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBONE(CSkinnedMesh::SJoint *inJoint)
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBONE";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	if (B3dStack.getLast().length > 8) {
		while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
		{
			u32 globalVertexID;
			f32 strength;
			B3DFile->read(&globalVertexID, sizeof(globalVertexID));
			B3DFile->read(&strength, sizeof(strength));
#ifdef __BIG_ENDIAN__
			globalVertexID = os::Byteswap::byteswap(globalVertexID);
			strength = os::Byteswap::byteswap(strength);
#endif
			globalVertexID += VerticesStart;

			if (globalVertexID >= AnimatedVertices_VertexID.size()) {
				os::Printer::log("Illegal vertex index found", B3DFile->getFileName(), ELL_ERROR);
				return false;
			}

			if (AnimatedVertices_VertexID[globalVertexID] == -1) {
				os::Printer::log("B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)");
			} else if (strength > 0) {
				CSkinnedMesh::SWeight *weight = AnimatedMesh->addWeight(inJoint);
				weight->strength = strength;
				// Find the meshbuffer and Vertex index from the Global Vertex ID:
				weight->vertex_id = AnimatedVertices_VertexID[globalVertexID];
				weight->buffer_id = AnimatedVertices_BufferID[globalVertexID];
			}
		}
	}

	B3dStack.erase(B3dStack.size() - 1);
	return true;
}